

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

void __thiscall
spvtools::opt::Module::ForEachInst
          (Module *this,function<void_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts)

{
  Instruction *pIVar1;
  pointer pIVar2;
  Instruction *pIVar3;
  pointer puVar4;
  bool run_on_debug_line_insts_00;
  function<void_(spvtools::opt::Instruction_*)> *f_00;
  char cVar5;
  undefined7 in_register_00000011;
  unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> *i;
  pointer puVar6;
  Instruction *pIVar7;
  Instruction *dbg_line;
  pointer pIVar8;
  Instruction *pIVar9;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_78;
  function<void_(spvtools::opt::Instruction_*)> *local_70;
  undefined8 local_68;
  code *local_60;
  code *local_58;
  undefined4 local_4c;
  Instruction *local_48;
  Module *local_40;
  function<void_(spvtools::opt::Instruction_*)> *local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000011,run_on_debug_line_insts);
  pIVar7 = (this->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_48 = &(this->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  local_40 = this;
  local_38 = f;
  if (pIVar7 != local_48) {
    do {
      pIVar1 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_68 = 0;
      local_58 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_manager;
      local_70 = local_38;
      if ((char)local_4c != '\0') {
        pIVar8 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar2 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar8 != pIVar2) {
          do {
            local_78._M_head_impl = pIVar8;
            if (local_60 == (code *)0x0) goto LAB_005f9b50;
            cVar5 = (*local_58)(&local_70,&local_78);
            if (cVar5 == '\0') goto LAB_005f900a;
            pIVar8 = pIVar8 + 1;
          } while (pIVar8 != pIVar2);
          local_78._M_head_impl = pIVar7;
          if (local_60 == (code *)0x0) goto LAB_005f9b50;
        }
      }
      local_78._M_head_impl = pIVar7;
      (*local_58)(&local_70,&local_78);
LAB_005f900a:
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,3);
      }
      pIVar7 = pIVar1;
    } while (pIVar1 != local_48);
  }
  pIVar7 = (local_40->extensions_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_48 = &(local_40->extensions_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (pIVar7 != local_48) {
    do {
      pIVar1 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_68 = 0;
      local_58 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_manager;
      local_70 = local_38;
      if ((char)local_4c != '\0') {
        pIVar9 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar3 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar9 != pIVar3) {
          do {
            local_78._M_head_impl = pIVar9;
            if (local_60 == (code *)0x0) goto LAB_005f9b50;
            cVar5 = (*local_58)(&local_70,&local_78);
            if (cVar5 == '\0') goto LAB_005f90f8;
            pIVar9 = pIVar9 + 1;
          } while (pIVar9 != pIVar3);
          local_78._M_head_impl = pIVar7;
          if (local_60 == (code *)0x0) goto LAB_005f9b50;
        }
      }
      local_78._M_head_impl = pIVar7;
      (*local_58)(&local_70,&local_78);
LAB_005f90f8:
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,3);
      }
      pIVar7 = pIVar1;
    } while (pIVar1 != local_48);
  }
  pIVar7 = (local_40->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_48 = &(local_40->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>.
              sentinel_;
  if (pIVar7 != local_48) {
    do {
      pIVar1 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_68 = 0;
      local_58 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_manager;
      local_70 = local_38;
      if ((char)local_4c != '\0') {
        pIVar9 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar3 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar9 != pIVar3) {
          do {
            local_78._M_head_impl = pIVar9;
            if (local_60 == (code *)0x0) goto LAB_005f9b50;
            cVar5 = (*local_58)(&local_70,&local_78);
            if (cVar5 == '\0') goto LAB_005f91e6;
            pIVar9 = pIVar9 + 1;
          } while (pIVar9 != pIVar3);
          local_78._M_head_impl = pIVar7;
          if (local_60 == (code *)0x0) goto LAB_005f9b50;
        }
      }
      local_78._M_head_impl = pIVar7;
      (*local_58)(&local_70,&local_78);
LAB_005f91e6:
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,3);
      }
      pIVar7 = pIVar1;
    } while (pIVar1 != local_48);
  }
  pIVar7 = (local_40->memory_model_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar7 != (Instruction *)0x0) {
    local_68 = 0;
    local_58 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
               ::_M_invoke;
    local_60 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
               ::_M_manager;
    local_70 = local_38;
    if ((char)local_4c != '\0') {
      pIVar8 = (pIVar7->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar2 = *(pointer *)
                ((long)&(pIVar7->dbg_line_insts_).
                        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                + 8);
      if (pIVar8 != pIVar2) {
        do {
          local_78._M_head_impl = pIVar8;
          if (local_60 == (code *)0x0) goto LAB_005f9b50;
          cVar5 = (*local_58)(&local_70,&local_78);
          if (cVar5 == '\0') goto LAB_005f92ba;
          pIVar8 = pIVar8 + 1;
        } while (pIVar8 != pIVar2);
        local_78._M_head_impl = pIVar7;
        if (local_60 == (code *)0x0) goto LAB_005f9b50;
      }
    }
    local_78._M_head_impl = pIVar7;
    (*local_58)(&local_70,&local_78);
LAB_005f92ba:
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,3);
    }
  }
  pIVar7 = (local_40->sampled_image_address_mode_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar7 != (Instruction *)0x0) {
    local_68 = 0;
    local_58 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
               ::_M_invoke;
    local_60 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
               ::_M_manager;
    local_70 = local_38;
    if ((char)local_4c != '\0') {
      pIVar8 = (pIVar7->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar2 = *(pointer *)
                ((long)&(pIVar7->dbg_line_insts_).
                        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                + 8);
      if (pIVar8 != pIVar2) {
        do {
          local_78._M_head_impl = pIVar8;
          if (local_60 == (code *)0x0) goto LAB_005f9b50;
          cVar5 = (*local_58)(&local_70,&local_78);
          if (cVar5 == '\0') goto LAB_005f937b;
          pIVar8 = pIVar8 + 1;
        } while (pIVar8 != pIVar2);
        local_78._M_head_impl = pIVar7;
        if (local_60 == (code *)0x0) {
LAB_005f9b50:
          std::__throw_bad_function_call();
        }
      }
    }
    local_78._M_head_impl = pIVar7;
    (*local_58)(&local_70,&local_78);
LAB_005f937b:
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,3);
    }
  }
  pIVar7 = (local_40->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_48 = &(local_40->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (pIVar7 != local_48) {
    do {
      pIVar1 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_68 = 0;
      local_58 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_manager;
      local_70 = local_38;
      if ((char)local_4c != '\0') {
        pIVar9 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar3 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar9 != pIVar3) {
          do {
            local_78._M_head_impl = pIVar9;
            if (local_60 == (code *)0x0) goto LAB_005f9b50;
            cVar5 = (*local_58)(&local_70,&local_78);
            if (cVar5 == '\0') goto LAB_005f9456;
            pIVar9 = pIVar9 + 1;
          } while (pIVar9 != pIVar3);
          local_78._M_head_impl = pIVar7;
          if (local_60 == (code *)0x0) goto LAB_005f9b50;
        }
      }
      local_78._M_head_impl = pIVar7;
      (*local_58)(&local_70,&local_78);
LAB_005f9456:
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,3);
      }
      pIVar7 = pIVar1;
    } while (pIVar1 != local_48);
  }
  pIVar7 = (local_40->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_48 = &(local_40->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
  ;
  if (pIVar7 != local_48) {
    do {
      pIVar1 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_68 = 0;
      local_58 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_manager;
      local_70 = local_38;
      if ((char)local_4c != '\0') {
        pIVar9 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar3 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar9 != pIVar3) {
          do {
            local_78._M_head_impl = pIVar9;
            if (local_60 == (code *)0x0) goto LAB_005f9b50;
            cVar5 = (*local_58)(&local_70,&local_78);
            if (cVar5 == '\0') goto LAB_005f9544;
            pIVar9 = pIVar9 + 1;
          } while (pIVar9 != pIVar3);
          local_78._M_head_impl = pIVar7;
          if (local_60 == (code *)0x0) goto LAB_005f9b50;
        }
      }
      local_78._M_head_impl = pIVar7;
      (*local_58)(&local_70,&local_78);
LAB_005f9544:
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,3);
      }
      pIVar7 = pIVar1;
    } while (pIVar1 != local_48);
  }
  pIVar7 = (local_40->debugs1_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_48 = &(local_40->debugs1_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (pIVar7 != local_48) {
    do {
      pIVar1 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_68 = 0;
      local_58 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_manager;
      local_70 = local_38;
      if ((char)local_4c != '\0') {
        pIVar9 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar3 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar9 != pIVar3) {
          do {
            local_78._M_head_impl = pIVar9;
            if (local_60 == (code *)0x0) goto LAB_005f9b50;
            cVar5 = (*local_58)(&local_70,&local_78);
            if (cVar5 == '\0') goto LAB_005f9632;
            pIVar9 = pIVar9 + 1;
          } while (pIVar9 != pIVar3);
          local_78._M_head_impl = pIVar7;
          if (local_60 == (code *)0x0) goto LAB_005f9b50;
        }
      }
      local_78._M_head_impl = pIVar7;
      (*local_58)(&local_70,&local_78);
LAB_005f9632:
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,3);
      }
      pIVar7 = pIVar1;
    } while (pIVar1 != local_48);
  }
  pIVar7 = (local_40->debugs2_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_48 = &(local_40->debugs2_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (pIVar7 != local_48) {
    do {
      pIVar1 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_68 = 0;
      local_58 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_manager;
      local_70 = local_38;
      if ((char)local_4c != '\0') {
        pIVar9 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar3 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar9 != pIVar3) {
          do {
            local_78._M_head_impl = pIVar9;
            if (local_60 == (code *)0x0) goto LAB_005f9b50;
            cVar5 = (*local_58)(&local_70,&local_78);
            if (cVar5 == '\0') goto LAB_005f9720;
            pIVar9 = pIVar9 + 1;
          } while (pIVar9 != pIVar3);
          local_78._M_head_impl = pIVar7;
          if (local_60 == (code *)0x0) goto LAB_005f9b50;
        }
      }
      local_78._M_head_impl = pIVar7;
      (*local_58)(&local_70,&local_78);
LAB_005f9720:
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,3);
      }
      pIVar7 = pIVar1;
    } while (pIVar1 != local_48);
  }
  pIVar7 = (local_40->debugs3_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_48 = &(local_40->debugs3_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (pIVar7 != local_48) {
    do {
      pIVar1 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_68 = 0;
      local_58 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_manager;
      local_70 = local_38;
      if ((char)local_4c != '\0') {
        pIVar9 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar3 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar9 != pIVar3) {
          do {
            local_78._M_head_impl = pIVar9;
            if (local_60 == (code *)0x0) goto LAB_005f9b50;
            cVar5 = (*local_58)(&local_70,&local_78);
            if (cVar5 == '\0') goto LAB_005f980e;
            pIVar9 = pIVar9 + 1;
          } while (pIVar9 != pIVar3);
          local_78._M_head_impl = pIVar7;
          if (local_60 == (code *)0x0) goto LAB_005f9b50;
        }
      }
      local_78._M_head_impl = pIVar7;
      (*local_58)(&local_70,&local_78);
LAB_005f980e:
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,3);
      }
      pIVar7 = pIVar1;
    } while (pIVar1 != local_48);
  }
  pIVar7 = (local_40->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
           .super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_48 = &(local_40->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.
              sentinel_;
  if (pIVar7 != local_48) {
    do {
      pIVar1 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_68 = 0;
      local_58 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_manager;
      local_70 = local_38;
      if ((char)local_4c != '\0') {
        pIVar9 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar3 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar9 != pIVar3) {
          do {
            local_78._M_head_impl = pIVar9;
            if (local_60 == (code *)0x0) goto LAB_005f9b50;
            cVar5 = (*local_58)(&local_70,&local_78);
            if (cVar5 == '\0') goto LAB_005f98fc;
            pIVar9 = pIVar9 + 1;
          } while (pIVar9 != pIVar3);
          local_78._M_head_impl = pIVar7;
          if (local_60 == (code *)0x0) goto LAB_005f9b50;
        }
      }
      local_78._M_head_impl = pIVar7;
      (*local_58)(&local_70,&local_78);
LAB_005f98fc:
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,3);
      }
      pIVar7 = pIVar1;
    } while (pIVar1 != local_48);
  }
  pIVar7 = (local_40->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_48 = &(local_40->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (pIVar7 != local_48) {
    do {
      pIVar1 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_68 = 0;
      local_58 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_manager;
      local_70 = local_38;
      if ((char)local_4c != '\0') {
        pIVar9 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar3 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar9 != pIVar3) {
          do {
            local_78._M_head_impl = pIVar9;
            if (local_60 == (code *)0x0) goto LAB_005f9b50;
            cVar5 = (*local_58)(&local_70,&local_78);
            if (cVar5 == '\0') goto LAB_005f99ea;
            pIVar9 = pIVar9 + 1;
          } while (pIVar9 != pIVar3);
          local_78._M_head_impl = pIVar7;
          if (local_60 == (code *)0x0) goto LAB_005f9b50;
        }
      }
      local_78._M_head_impl = pIVar7;
      (*local_58)(&local_70,&local_78);
LAB_005f99ea:
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,3);
      }
      pIVar7 = pIVar1;
    } while (pIVar1 != local_48);
  }
  pIVar7 = (local_40->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_48 = &(local_40->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (pIVar7 != local_48) {
    do {
      pIVar1 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_68 = 0;
      local_58 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_manager;
      local_70 = local_38;
      if ((char)local_4c != '\0') {
        pIVar9 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar3 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar9 != pIVar3) {
          do {
            local_78._M_head_impl = pIVar9;
            if (local_60 == (code *)0x0) goto LAB_005f9b50;
            cVar5 = (*local_58)(&local_70,&local_78);
            if (cVar5 == '\0') goto LAB_005f9ad8;
            pIVar9 = pIVar9 + 1;
          } while (pIVar9 != pIVar3);
          local_78._M_head_impl = pIVar7;
          if (local_60 == (code *)0x0) goto LAB_005f9b50;
        }
      }
      local_78._M_head_impl = pIVar7;
      (*local_58)(&local_70,&local_78);
LAB_005f9ad8:
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,3);
      }
      pIVar7 = pIVar1;
    } while (pIVar1 != local_48);
  }
  f_00 = local_38;
  puVar6 = (local_40->functions_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (local_40->functions_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar4) {
    run_on_debug_line_insts_00 = (bool)(char)local_4c;
    do {
      opt::Function::ForEachInst
                ((puVar6->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                 .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl,f_00,
                 run_on_debug_line_insts_00,true);
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar4);
  }
  return;
}

Assistant:

void Module::ForEachInst(const std::function<void(Instruction*)>& f,
                         bool run_on_debug_line_insts) {
#define DELEGATE(list) list.ForEachInst(f, run_on_debug_line_insts)
  DELEGATE(capabilities_);
  DELEGATE(extensions_);
  DELEGATE(ext_inst_imports_);
  if (memory_model_) memory_model_->ForEachInst(f, run_on_debug_line_insts);
  if (sampled_image_address_mode_)
    sampled_image_address_mode_->ForEachInst(f, run_on_debug_line_insts);
  DELEGATE(entry_points_);
  DELEGATE(execution_modes_);
  DELEGATE(debugs1_);
  DELEGATE(debugs2_);
  DELEGATE(debugs3_);
  DELEGATE(ext_inst_debuginfo_);
  DELEGATE(annotations_);
  DELEGATE(types_values_);
  for (auto& i : functions_) {
    i->ForEachInst(f, run_on_debug_line_insts,
                   /* run_on_non_semantic_insts = */ true);
  }
#undef DELEGATE
}